

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateParsingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if ($has_not_property_check$) {\n  $name$_ = new $type_name$();\n}\ninput.ReadMessage($name$_);\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::GenerateParsingCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_not_property_check$) {\n"
    "  $name$_ = new $type_name$();\n"
    "}\n"
    // TODO(jonskeet): Do we really need merging behaviour like this?
    "input.ReadMessage($name$_);\n"); // No need to support TYPE_GROUP...
}